

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O0

void extents_traverse_func
               (void *closure,plutovg_path_command_t command,plutovg_point_t *points,int npoints)

{
  float fVar1;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  int local_34;
  int i;
  extents_calculator_t *calculator;
  int npoints_local;
  plutovg_point_t *points_local;
  plutovg_path_command_t command_local;
  void *closure_local;
  
  if ((*(byte *)((long)closure + 8) & 1) == 0) {
    for (local_34 = 0; local_34 < npoints; local_34 = local_34 + 1) {
      if (points[local_34].x <= *(float *)((long)closure + 0x10)) {
        local_38 = points[local_34].x;
      }
      else {
        local_38 = *(float *)((long)closure + 0x10);
      }
      *(float *)((long)closure + 0x10) = local_38;
      if (points[local_34].y <= *(float *)((long)closure + 0x14)) {
        local_3c = points[local_34].y;
      }
      else {
        local_3c = *(float *)((long)closure + 0x14);
      }
      *(float *)((long)closure + 0x14) = local_3c;
      if (*(float *)((long)closure + 0x18) < points[local_34].x ||
          *(float *)((long)closure + 0x18) == points[local_34].x) {
        local_40 = points[local_34].x;
      }
      else {
        local_40 = *(float *)((long)closure + 0x18);
      }
      *(float *)((long)closure + 0x18) = local_40;
      if (*(float *)((long)closure + 0x1c) < points[local_34].y ||
          *(float *)((long)closure + 0x1c) == points[local_34].y) {
        local_44 = points[local_34].y;
      }
      else {
        local_44 = *(float *)((long)closure + 0x1c);
      }
      *(float *)((long)closure + 0x1c) = local_44;
      if (command != PLUTOVG_PATH_COMMAND_MOVE_TO) {
        fVar1 = hypotf(points[local_34].x - *closure,
                       points[local_34].y - *(float *)((long)closure + 4));
        *(float *)((long)closure + 0xc) = fVar1 + *(float *)((long)closure + 0xc);
      }
      *(plutovg_point_t *)closure = points[local_34];
    }
  }
  else {
    if (command != PLUTOVG_PATH_COMMAND_MOVE_TO) {
      __assert_fail("command == PLUTOVG_PATH_COMMAND_MOVE_TO",
                    "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]plutosvg/plutovg/source/plutovg-path.c"
                    ,0x2a8,
                    "void extents_traverse_func(void *, plutovg_path_command_t, const plutovg_point_t *, int)"
                   );
    }
    *(undefined1 *)((long)closure + 8) = 0;
    *(plutovg_point_t *)closure = *points;
    *(float *)((long)closure + 0x10) = points->x;
    *(float *)((long)closure + 0x14) = points->y;
    *(float *)((long)closure + 0x18) = points->x;
    *(float *)((long)closure + 0x1c) = points->y;
    *(undefined4 *)((long)closure + 0xc) = 0;
  }
  return;
}

Assistant:

static void extents_traverse_func(void* closure, plutovg_path_command_t command, const plutovg_point_t* points, int npoints)
{
    extents_calculator_t* calculator = (extents_calculator_t*)(closure);
    if(calculator->is_first_point) {
        assert(command == PLUTOVG_PATH_COMMAND_MOVE_TO);
        calculator->is_first_point = false;
        calculator->current_point = points[0];
        calculator->x1 = points[0].x;
        calculator->y1 = points[0].y;
        calculator->x2 = points[0].x;
        calculator->y2 = points[0].y;
        calculator->length = 0;
        return;
    }

    for(int i = 0; i < npoints; ++i) {
        calculator->x1 = plutovg_min(calculator->x1, points[i].x);
        calculator->y1 = plutovg_min(calculator->y1, points[i].y);
        calculator->x2 = plutovg_max(calculator->x2, points[i].x);
        calculator->y2 = plutovg_max(calculator->y2, points[i].y);
        if(command != PLUTOVG_PATH_COMMAND_MOVE_TO)
            calculator->length += hypotf(points[i].x - calculator->current_point.x, points[i].y - calculator->current_point.y);
        calculator->current_point = points[i];
    }
}